

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O1

void InstructionSet::M68k::Primitive::multiply<true,CPU::MC68000::ProcessorBase>
               (uint16_t source,uint32_t *destination,Status *status,ProcessorBase *flow_controller)

{
  uint uVar1;
  uint uVar2;
  undefined6 in_register_0000003a;
  
  uVar1 = (uint)CONCAT62(in_register_0000003a,source);
  uVar2 = (ushort)*destination * uVar1;
  *destination = uVar2;
  status->overflow_flag = 0;
  status->negative_flag = 0;
  status->carry_flag = 0;
  status->zero_result = (ulong)uVar2;
  uVar1 = (uVar1 & 0x5555) + ((uint)(CONCAT62(in_register_0000003a,source) >> 1) & 0x5555);
  uVar1 = (uVar1 & 0x3333) + (uVar1 >> 2 & 0x3333);
  uVar1 = (uVar1 & 0x707) + (uVar1 >> 4 & 0x707);
  flow_controller->dynamic_instruction_length_ = uVar1 + (uVar1 >> 8) + 0x11 & 0xff;
  return;
}

Assistant:

void multiply(uint16_t source, uint32_t &destination, Status &status, FlowController &flow_controller) {
	if constexpr (is_mulu) {
		destination = source * uint16_t(destination);
	} else {
		destination = u_extend16(source) * u_extend16(uint16_t(destination));
	}
	status.carry_flag = status.overflow_flag = 0;
	status.set_neg_zero(destination);

	if constexpr (is_mulu) {
		flow_controller.did_mulu(source);
	} else {
		flow_controller.did_muls(source);
	}
}